

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O3

uint __thiscall
QFragmentMapData<QTextBlockData>::erase_single(QFragmentMapData<QTextBlockData> *this,uint z)

{
  quint32 *pqVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint *puVar10;
  ulong uVar11;
  Header *pHVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  quint32 qVar18;
  
  uVar6 = previous(this,z);
  pHVar12 = (this->field_0).head;
  uVar17 = (ulong)z;
  puVar10 = (uint *)((long)pHVar12 + uVar17 * 0x48 + 8);
  uVar7 = (ulong)*(uint *)((long)pHVar12 + uVar17 * 0x48 + 4);
  if (uVar7 == 0) {
LAB_004d6aa2:
    uVar8 = (ulong)*puVar10;
  }
  else {
    uVar3 = *puVar10;
    if (*puVar10 == 0) {
      puVar10 = (uint *)((long)pHVar12 + uVar17 * 0x48 + 4);
      goto LAB_004d6aa2;
    }
    do {
      uVar15 = uVar3;
      uVar11 = (ulong)uVar15;
      uVar3 = *(uint *)((long)pHVar12 + uVar11 * 0x48 + 4);
    } while (uVar3 != 0);
    uVar3 = *(uint *)((long)pHVar12 + uVar11 * 0x48 + 8);
    uVar8 = (ulong)uVar3;
    if (uVar15 != z) {
      *(uint *)((long)pHVar12 + uVar7 * 0x48) = uVar15;
      lVar14 = uVar17 * 0x48;
      *(undefined4 *)((long)(this->field_0).head + uVar11 * 0x48 + 4) =
           *(undefined4 *)((long)(this->field_0).head + lVar14 + 4);
      lVar16 = 0;
      do {
        *(undefined4 *)((long)(this->field_0).head + lVar16 * 4 + uVar11 * 0x48 + 0x10) =
             *(undefined4 *)((long)(this->field_0).head + lVar16 * 4 + lVar14 + 0x10);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 3);
      pHVar12 = (this->field_0).head;
      if (uVar15 == *(uint *)((long)pHVar12 + uVar17 * 0x48 + 8)) {
LAB_004d6a92:
        uVar7 = (ulong)uVar15;
      }
      else {
        uVar4 = *(uint *)((long)pHVar12 + uVar11 * 0x48);
        uVar7 = (ulong)uVar4;
        if (uVar3 != 0) {
          *(uint *)((long)pHVar12 + uVar8 * 0x48) = uVar4;
          pHVar12 = (this->field_0).head;
        }
        *(uint *)((long)pHVar12 + uVar7 * 0x48 + 4) = uVar3;
        *(undefined4 *)((long)(this->field_0).head + uVar11 * 0x48 + 8) =
             *(undefined4 *)((long)(this->field_0).head + lVar14 + 8);
        *(uint *)((long)(this->field_0).head +
                 (ulong)*(uint *)((long)(this->field_0).head + lVar14 + 8) * 0x48) = uVar15;
        if (uVar4 == uVar15) {
          pHVar12 = (this->field_0).head;
          goto LAB_004d6a92;
        }
        uVar13 = uVar7;
        do {
          lVar16 = 0;
          do {
            piVar2 = (int *)((long)(this->field_0).head + lVar16 * 4 + uVar13 * 0x48 + 0x10);
            *piVar2 = *piVar2 - *(int *)((long)(this->field_0).head +
                                        lVar16 * 4 + uVar11 * 0x48 + 0x1c);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
          pHVar12 = (this->field_0).head;
          uVar3 = *(uint *)((long)pHVar12 + uVar13 * 0x48);
          uVar13 = (ulong)uVar3;
        } while (uVar3 != uVar15);
      }
      uVar3 = *(uint *)((long)pHVar12 + uVar17 * 0x48);
      uVar13 = (ulong)uVar3;
      if (uVar13 == 0) {
        pHVar12->root = uVar15;
      }
      else if (*(uint *)((long)pHVar12 + uVar13 * 0x48 + 4) == z) {
        *(uint *)((long)pHVar12 + uVar13 * 0x48 + 4) = uVar15;
        lVar16 = 0;
        do {
          piVar2 = (int *)((long)(this->field_0).head + lVar16 * 4 + uVar13 * 0x48 + 0x10);
          *piVar2 = *piVar2 - *(int *)((long)(this->field_0).head +
                                      lVar16 * 4 + uVar17 * 0x48 + 0x1c);
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
      }
      else {
        *(uint *)((long)pHVar12 + uVar13 * 0x48 + 8) = uVar15;
      }
      lVar16 = uVar11 * 0x48;
      *(uint *)((long)(this->field_0).head + lVar16) = uVar3;
      pHVar12 = (this->field_0).head;
      uVar5 = *(undefined4 *)((long)pHVar12 + lVar16 + 0xc);
      *(undefined4 *)((long)pHVar12 + lVar16 + 0xc) = *(undefined4 *)((long)pHVar12 + lVar14 + 0xc);
      *(undefined4 *)((long)(this->field_0).head + lVar14 + 0xc) = uVar5;
      goto LAB_004d6bea;
    }
  }
  uVar3 = *(uint *)((long)pHVar12 + uVar17 * 0x48);
  uVar7 = (ulong)uVar3;
  qVar18 = (quint32)uVar8;
  if (qVar18 != 0) {
    *(uint *)((long)pHVar12 + uVar8 * 0x48) = uVar3;
  }
  pHVar12 = (this->field_0).head;
  if (uVar3 == 0) {
    pHVar12->root = qVar18;
    uVar7 = 0;
  }
  else if (*(uint *)((long)pHVar12 + uVar7 * 0x48 + 4) == z) {
    *(quint32 *)((long)pHVar12 + uVar7 * 0x48 + 4) = qVar18;
    lVar14 = 0;
    do {
      piVar2 = (int *)((long)(this->field_0).head + lVar14 * 4 + uVar7 * 0x48 + 0x10);
      *piVar2 = *piVar2 - *(int *)((long)(this->field_0).head + lVar14 * 4 + uVar17 * 0x48 + 0x1c);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
  }
  else {
    *(quint32 *)((long)pHVar12 + uVar7 * 0x48 + 8) = qVar18;
  }
LAB_004d6bea:
  pHVar12 = (this->field_0).head;
  uVar3 = *(uint *)((long)pHVar12 + uVar17 * 0x48);
  if (uVar3 != 0) {
    uVar9 = z;
    do {
      uVar15 = uVar3;
      uVar11 = (ulong)uVar15;
      if (*(uint *)((long)pHVar12 + uVar11 * 0x48 + 4) == uVar9) {
        lVar14 = 0;
        do {
          piVar2 = (int *)((long)(this->field_0).head + lVar14 * 4 + uVar11 * 0x48 + 0x10);
          *piVar2 = *piVar2 - *(int *)((long)(this->field_0).head +
                                      lVar14 * 4 + uVar17 * 0x48 + 0x1c);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        pHVar12 = (this->field_0).head;
      }
      uVar3 = *(uint *)((long)pHVar12 + uVar11 * 0x48);
      uVar9 = uVar15;
    } while (uVar3 != 0);
  }
  *(quint32 *)((long)pHVar12 + uVar17 * 0x48 + 8) = pHVar12->freelist;
  ((this->field_0).head)->freelist = z;
  pqVar1 = &((this->field_0).head)->node_count;
  *pqVar1 = *pqVar1 - 1;
  pHVar12 = (this->field_0).head;
  if (*(int *)((long)pHVar12 + uVar17 * 0x48 + 0xc) != 0) {
    if (*(int *)((long)pHVar12 + uVar8 * 0x48) != 0) {
      puVar10 = (uint *)((long)pHVar12 + uVar8 * 0x48);
      do {
        uVar17 = uVar7;
        if (((uint)uVar8 != 0) && (puVar10[3] != 1)) goto LAB_004d6f2f;
        uVar3 = *(uint *)((long)pHVar12 + uVar17 * 0x48 + 4);
        uVar7 = (ulong)uVar3;
        uVar9 = (uint)uVar17;
        if ((uint)uVar8 != uVar3) {
          if (*(int *)((long)pHVar12 + uVar7 * 0x48 + 0xc) == 0) {
            *(undefined4 *)((long)pHVar12 + uVar7 * 0x48 + 0xc) = 1;
            *(undefined4 *)((long)(this->field_0).head + uVar17 * 0x48 + 0xc) = 0;
            rotateRight(this,uVar9);
            pHVar12 = (this->field_0).head;
            uVar7 = (ulong)*(uint *)((long)pHVar12 + uVar17 * 0x48 + 4);
          }
          lVar14 = (long)pHVar12 + uVar7 * 0x48;
          uVar11 = (ulong)*(uint *)(lVar14 + 8);
          if ((uVar11 == 0) || (*(int *)((long)pHVar12 + uVar11 * 0x48 + 0xc) == 1)) {
            uVar13 = (ulong)*(uint *)(lVar14 + 4);
            if ((uVar13 == 0) || (*(int *)((long)pHVar12 + uVar13 * 0x48 + 0xc) == 1))
            goto LAB_004d6db2;
LAB_004d6de6:
            if (*(int *)((long)pHVar12 + uVar13 * 0x48 + 0xc) == 1) {
              if (uVar11 != 0) goto LAB_004d6dfa;
              goto LAB_004d6e0a;
            }
          }
          else {
            uVar13 = (ulong)*(uint *)(lVar14 + 4);
            if (*(uint *)(lVar14 + 4) != 0) goto LAB_004d6de6;
LAB_004d6dfa:
            *(undefined4 *)((long)pHVar12 + uVar11 * 0x48 + 0xc) = 1;
            pHVar12 = (this->field_0).head;
LAB_004d6e0a:
            *(undefined4 *)((long)pHVar12 + uVar7 * 0x48 + 0xc) = 0;
            rotateLeft(this,*(uint *)((long)(this->field_0).head + uVar17 * 0x48 + 4));
            pHVar12 = (this->field_0).head;
            uVar7 = (ulong)*(uint *)((long)pHVar12 + uVar17 * 0x48 + 4);
          }
          *(undefined4 *)((long)pHVar12 + uVar7 * 0x48 + 0xc) =
               *(undefined4 *)((long)pHVar12 + uVar17 * 0x48 + 0xc);
          *(undefined4 *)((long)(this->field_0).head + uVar17 * 0x48 + 0xc) = 1;
          uVar7 = (ulong)*(uint *)((long)(this->field_0).head + uVar7 * 0x48 + 4);
          if (uVar7 != 0) {
            *(undefined4 *)((long)(this->field_0).head + uVar7 * 0x48 + 0xc) = 1;
          }
          rotateRight(this,uVar9);
          break;
        }
        uVar7 = (ulong)*(uint *)((long)pHVar12 + uVar17 * 0x48 + 8);
        if (*(int *)((long)pHVar12 + uVar7 * 0x48 + 0xc) == 0) {
          *(undefined4 *)((long)pHVar12 + uVar7 * 0x48 + 0xc) = 1;
          *(undefined4 *)((long)(this->field_0).head + uVar17 * 0x48 + 0xc) = 0;
          rotateLeft(this,uVar9);
          pHVar12 = (this->field_0).head;
          uVar7 = (ulong)*(uint *)((long)pHVar12 + uVar17 * 0x48 + 8);
        }
        lVar14 = (long)pHVar12 + uVar7 * 0x48;
        uVar11 = (ulong)*(uint *)(lVar14 + 4);
        if ((uVar11 != 0) && (*(int *)((long)pHVar12 + uVar11 * 0x48 + 0xc) != 1)) {
          uVar13 = (ulong)*(uint *)(lVar14 + 8);
          if (*(uint *)(lVar14 + 8) != 0) goto LAB_004d6e8b;
LAB_004d6e9f:
          *(undefined4 *)((long)pHVar12 + uVar11 * 0x48 + 0xc) = 1;
          pHVar12 = (this->field_0).head;
LAB_004d6eaf:
          *(undefined4 *)((long)pHVar12 + uVar7 * 0x48 + 0xc) = 0;
          rotateRight(this,*(uint *)((long)(this->field_0).head + uVar17 * 0x48 + 8));
          pHVar12 = (this->field_0).head;
          uVar7 = (ulong)*(uint *)((long)pHVar12 + uVar17 * 0x48 + 8);
LAB_004d6edb:
          *(undefined4 *)((long)pHVar12 + uVar7 * 0x48 + 0xc) =
               *(undefined4 *)((long)pHVar12 + uVar17 * 0x48 + 0xc);
          *(undefined4 *)((long)(this->field_0).head + uVar17 * 0x48 + 0xc) = 1;
          uVar7 = (ulong)*(uint *)((long)(this->field_0).head + uVar7 * 0x48 + 8);
          if (uVar7 != 0) {
            *(undefined4 *)((long)(this->field_0).head + uVar7 * 0x48 + 0xc) = 1;
          }
          rotateLeft(this,uVar9);
          break;
        }
        uVar13 = (ulong)*(uint *)(lVar14 + 8);
        if ((uVar13 != 0) && (*(int *)((long)pHVar12 + uVar13 * 0x48 + 0xc) != 1)) {
LAB_004d6e8b:
          if (*(int *)((long)pHVar12 + uVar13 * 0x48 + 0xc) == 1) {
            if (uVar11 != 0) goto LAB_004d6e9f;
            goto LAB_004d6eaf;
          }
          goto LAB_004d6edb;
        }
LAB_004d6db2:
        *(undefined4 *)(lVar14 + 0xc) = 0;
        pHVar12 = (this->field_0).head;
        puVar10 = (uint *)((long)pHVar12 + uVar17 * 0x48);
        uVar7 = (ulong)*puVar10;
        uVar8 = uVar17;
      } while (*puVar10 != 0);
    }
    if ((int)uVar8 != 0) {
      pHVar12 = (this->field_0).head;
LAB_004d6f2f:
      *(undefined4 *)((long)pHVar12 + uVar8 * 0x48 + 0xc) = 1;
    }
  }
  return uVar6;
}

Assistant:

uint QFragmentMapData<Fragment>::erase_single(uint z)
{
    uint w = previous(z);
    uint y = z;
    uint x;
    uint p;

    if (!F(y).left) {
        x = F(y).right;
    } else if (!F(y).right) {
        x = F(y).left;
    } else {
        y = F(y).right;
        while (F(y).left)
            y = F(y).left;
        x = F(y).right;
    }

    if (y != z) {
        F(F(z).left).parent = y;
        F(y).left = F(z).left;
        for (uint field = 0; field < Fragment::size_array_max; ++field)
            F(y).size_left_array[field] = F(z).size_left_array[field];
        if (y != F(z).right) {
            /*
                     z                y
                    / \              / \
                   a   b            a   b
                      /                /
                    ...     -->      ...
                    /                /
                   y                x
                  / \
                 0   x
             */
            p = F(y).parent;
            if (x)
                F(x).parent = p;
            F(p).left = x;
            F(y).right = F(z).right;
            F(F(z).right).parent = y;
            uint n = p;
            while (n != y) {
                for (uint field = 0; field < Fragment::size_array_max; ++field)
                    F(n).size_left_array[field] -= F(y).size_array[field];
                n = F(n).parent;
            }
        } else {
            /*
                     z                y
                    / \              / \
                   a   y     -->    a   x
                      / \
                     0   x
             */
            p = y;
        }
        uint zp = F(z).parent;
        if (!zp) {
            Q_ASSERT(head->root == z);
            head->root = y;
        } else if (F(zp).left == z) {
            F(zp).left = y;
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(zp).size_left_array[field] -= F(z).size_array[field];
        } else {
            F(zp).right = y;
        }
        F(y).parent = zp;
        // Swap the colors
        uint c = F(y).color;
        F(y).color = F(z).color;
        F(z).color = c;
        y = z;
    } else {
        /*
                p          p            p          p
               /          /              \          \
              z    -->   x                z  -->     x
              |                           |
              x                           x
         */
        p = F(z).parent;
        if (x)
            F(x).parent = p;
        if (!p) {
            Q_ASSERT(head->root == z);
            head->root = x;
        } else if (F(p).left == z) {
            F(p).left = x;
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(p).size_left_array[field] -= F(z).size_array[field];
        } else {
            F(p).right = x;
        }
    }
    uint n = z;
    while (F(n).parent) {
        uint p = F(n).parent;
        if (F(p).left == n) {
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(p).size_left_array[field] -= F(z).size_array[field];
        }
        n = p;
    }

    freeFragment(z);


    if (F(y).color != Red) {
        while (F(x).parent && (x == 0 || F(x).color == Black)) {
            if (x == F(p).left) {
                uint w = F(p).right;
                if (F(w).color == Red) {
                    F(w).color = Black;
                    F(p).color = Red;
                    rotateLeft(p);
                    w = F(p).right;
                }
                if ((F(w).left == 0 || F(F(w).left).color == Black) &&
                    (F(w).right == 0 || F(F(w).right).color == Black)) {
                    F(w).color = Red;
                    x = p;
                    p = F(x).parent;
                } else {
                    if (F(w).right == 0 || F(F(w).right).color == Black) {
                        if (F(w).left)
                            F(F(w).left).color = Black;
                        F(w).color = Red;
                        rotateRight(F(p).right);
                        w = F(p).right;
                    }
                    F(w).color = F(p).color;
                    F(p).color = Black;
                    if (F(w).right)
                        F(F(w).right).color = Black;
                    rotateLeft(p);
                    break;
                }
            } else {
                uint w = F(p).left;
                if (F(w).color == Red) {
                    F(w).color = Black;
                    F(p).color = Red;
                    rotateRight(p);
                    w = F(p).left;
                }
                if ((F(w).right == 0 || F(F(w).right).color == Black) &&
                    (F(w).left == 0 || F(F(w).left).color == Black)) {
                    F(w).color = Red;
                    x = p;
                    p = F(x).parent;
                } else {
                    if (F(w).left == 0 || F(F(w).left).color == Black) {
                        if (F(w).right)
                            F(F(w).right).color = Black;
                        F(w).color = Red;
                        rotateLeft(F(p).left);
                        w = F(p).left;
                    }
                    F(w).color = F(p).color;
                    F(p).color = Black;
                    if (F(w).left)
                        F(F(w).left).color = Black;
                    rotateRight(p);
                    break;
                }
            }
        }
        if (x)
            F(x).color = Black;
    }

    return w;
}